

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O0

int SUNNonlinSolInitialize_Newton(SUNNonlinearSolver NLS)

{
  SUNNonlinearSolver NLS_local;
  int local_4;
  
  if (NLS == (SUNNonlinearSolver)0x0) {
    local_4 = -0x385;
  }
  else if (((*NLS->content == 0) || (*(long *)((long)NLS->content + 0x10) == 0)) ||
          (*(long *)((long)NLS->content + 0x18) == 0)) {
    local_4 = -0x385;
  }
  else {
    *(undefined8 *)((long)NLS->content + 0x38) = 0;
    *(undefined8 *)((long)NLS->content + 0x40) = 0;
    *(undefined4 *)((long)NLS->content + 0x28) = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNNonlinSolInitialize_Newton(SUNNonlinearSolver NLS)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL) return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (NEWTON_CONTENT(NLS)->Sys    == NULL) ||
       (NEWTON_CONTENT(NLS)->LSolve == NULL) ||
       (NEWTON_CONTENT(NLS)->CTest  == NULL) ) {
    return(SUN_NLS_MEM_NULL);
  }

  /* reset the total number of iterations and convergence failures */
  NEWTON_CONTENT(NLS)->niters     = 0;
  NEWTON_CONTENT(NLS)->nconvfails = 0;

  /* reset the Jacobian status */
  NEWTON_CONTENT(NLS)->jcur = SUNFALSE;

  return(SUN_NLS_SUCCESS);
}